

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  stbtt_packedchar *psVar1;
  undefined4 *puVar2;
  float *pfVar3;
  float *pfVar4;
  ushort uVar5;
  ushort uVar6;
  undefined1 uVar9;
  uchar *puVar7;
  undefined6 uVar10;
  stbtt_packedchar *psVar8;
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  float fVar20;
  float fVar21;
  float fVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [15];
  undefined1 auVar30 [13];
  undefined1 auVar31 [14];
  undefined1 auVar32 [15];
  uint6 uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  stbrp_coord *psVar40;
  long lVar41;
  stbtt_pack_range *psVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  short sVar46;
  undefined1 auVar45 [16];
  int y0;
  int x0;
  int advance;
  int y1;
  int x1;
  int lsb;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [16];
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  stbtt_pack_range *local_98;
  stbrp_coord *local_90;
  ulong local_88;
  ulong local_80;
  stbtt_pack_range *local_78;
  stbtt_packedchar *local_70;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  local_58._0_4_ = spc->h_oversample;
  local_58._4_4_ = spc->v_oversample;
  uStack_50 = 0;
  if (num_ranges < 1) {
    iVar35 = 1;
  }
  else {
    local_88 = (ulong)(uint)num_ranges;
    psVar40 = &rects->w;
    iVar35 = 1;
    uVar43 = 0xffffffff;
    local_80 = 0;
    iVar36 = 0;
    local_98 = ranges;
    local_90 = psVar40;
    do {
      local_a8 = ranges[local_80].font_size;
      uStack_a4 = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      if (local_a8 <= 0.0) {
        uStack_a4 = 0x80000000;
        uStack_a0 = 0x80000000;
        uStack_9c = 0x80000000;
        local_a8 = -local_a8;
        uVar38 = (uint)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                               *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
      }
      else {
        puVar7 = info->data;
        lVar41 = (long)info->hhea;
        uVar38 = ((int)(short)((ushort)puVar7[lVar41 + 4] << 8) | (uint)puVar7[lVar41 + 5]) -
                 ((int)(short)((ushort)puVar7[lVar41 + 6] << 8) | (uint)puVar7[lVar41 + 7]);
      }
      local_a8 = local_a8 / (float)(int)uVar38;
      psVar42 = ranges + local_80;
      uVar37._0_1_ = psVar42->h_oversample;
      uVar9 = psVar42->v_oversample;
      uVar10 = *(undefined6 *)&psVar42->field_0x22;
      uVar37._1_7_ = CONCAT61(uVar10,uVar9);
      uVar39 = (uint)uVar37 & 0xff;
      spc->h_oversample = uVar39;
      uVar38 = (uint)uVar37._1_7_ & 0xff;
      spc->v_oversample = uVar38;
      local_b8._4_4_ = 0.0;
      local_b8._0_4_ = 0.0;
      if ((undefined1)uVar37 != 0) {
        local_b8._0_4_ = (float)(int)(1 - uVar39) / ((float)uVar39 + (float)uVar39);
      }
      if ((uVar37 & 0xff00) != 0) {
        local_b8._4_4_ = (float)(int)(1 - uVar38) / ((float)uVar38 + (float)uVar38);
      }
      if (0 < psVar42->num_chars) {
        auVar11._8_6_ = 0;
        auVar11._0_8_ = uVar37;
        auVar11[0xe] = (char)((uint6)uVar10 >> 0x28);
        auVar13._8_4_ = 0;
        auVar13._0_8_ = uVar37;
        auVar13[0xc] = (char)((uint6)uVar10 >> 0x20);
        auVar13._13_2_ = auVar11._13_2_;
        auVar14._8_4_ = 0;
        auVar14._0_8_ = uVar37;
        auVar14._12_3_ = auVar13._12_3_;
        auVar15._8_2_ = 0;
        auVar15._0_8_ = uVar37;
        auVar15[10] = (char)((uint6)uVar10 >> 0x18);
        auVar15._11_4_ = auVar14._11_4_;
        auVar16._8_2_ = 0;
        auVar16._0_8_ = uVar37;
        auVar16._10_5_ = auVar15._10_5_;
        auVar17[8] = (char)((uint6)uVar10 >> 0x10);
        auVar17._0_8_ = uVar37;
        auVar17._9_6_ = auVar16._9_6_;
        auVar27._7_8_ = 0;
        auVar27._0_7_ = auVar17._8_7_;
        Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),(char)((uint6)uVar10 >> 8));
        auVar32._9_6_ = 0;
        auVar32._0_9_ = Var28;
        auVar18[4] = (char)uVar10;
        auVar18._0_4_ = (uint)uVar37;
        auVar18._5_10_ = SUB1510(auVar32 << 0x30,5);
        auVar29._11_4_ = 0;
        auVar29._0_11_ = auVar18._4_11_;
        auVar30._1_12_ = SUB1512(auVar29 << 0x20,3);
        auVar30[0] = uVar9;
        auVar19._2_13_ = auVar30;
        auVar19._0_2_ = CONCAT11(0,(undefined1)uVar37);
        auVar12._10_2_ = 0;
        auVar12._0_10_ = auVar19._0_10_;
        auVar12._12_2_ = (short)Var28;
        uVar33 = CONCAT42(auVar12._10_4_,auVar18._4_2_);
        auVar31._6_8_ = 0;
        auVar31._0_6_ = uVar33;
        auVar44._0_4_ = (float)CONCAT11(0,(undefined1)uVar37);
        auVar44._4_4_ = (float)(int)CONCAT82(SUB148(auVar31 << 0x40,6),auVar30._0_2_);
        auVar44._8_4_ = (float)(int)uVar33;
        auVar44._12_4_ = (float)(auVar12._10_4_ >> 0x10);
        local_48._0_16_ = divps(_DAT_0015c250,auVar44);
        local_b8._8_8_ = 0;
        psVar40 = psVar40 + (long)iVar36 * 8;
        lVar41 = 0;
        uVar37 = 0;
        local_78 = psVar42;
        do {
          if (((*(uint *)(psVar40 + 4) == 0) || (uVar5 = *psVar40, uVar5 == 0)) ||
             (uVar6 = psVar40[1], uVar6 == 0)) {
            if (((*(uint *)(psVar40 + 4) == 0) || (spc->skip_missing != 0)) ||
               ((*psVar40 != 0 || ((psVar40[1] != 0 || ((int)uVar43 < 0)))))) {
              iVar35 = 0;
            }
            else {
              psVar8 = psVar42->chardata_for_range;
              psVar1 = psVar8 + uVar43;
              uVar23 = *(undefined4 *)psVar1;
              uVar24 = *(undefined4 *)&psVar1->x1;
              fVar25 = psVar1->xoff;
              fVar26 = psVar1->yoff;
              pfVar3 = &psVar8[uVar43].yoff;
              fVar20 = pfVar3[1];
              fVar21 = pfVar3[2];
              fVar22 = pfVar3[3];
              pfVar4 = (float *)((long)&psVar8->yoff + lVar41);
              *pfVar4 = *pfVar3;
              pfVar4[1] = fVar20;
              pfVar4[2] = fVar21;
              pfVar4[3] = fVar22;
              puVar2 = (undefined4 *)((long)&psVar8->x0 + lVar41);
              *puVar2 = uVar23;
              puVar2[1] = uVar24;
              puVar2[2] = fVar25;
              puVar2[3] = fVar26;
            }
          }
          else {
            if (psVar42->array_of_unicode_codepoints == (int *)0x0) {
              iVar34 = psVar42->first_unicode_codepoint_in_range + (int)uVar37;
            }
            else {
              iVar34 = psVar42->array_of_unicode_codepoints[uVar37];
            }
            local_70 = psVar42->chardata_for_range;
            iVar34 = stbtt_FindGlyphIndex(info,iVar34);
            uVar38 = spc->padding;
            auVar44 = pshuflw(ZEXT416(uVar38),ZEXT416(uVar38),0);
            *(uint *)(psVar40 + 2) =
                 CONCAT22(auVar44._2_2_ + (short)(*(uint *)(psVar40 + 2) >> 0x10),
                          auVar44._0_2_ + (short)*(uint *)(psVar40 + 2));
            *psVar40 = uVar5 - (short)uVar38;
            psVar40[1] = uVar6 - (short)uVar38;
            stbtt_GetGlyphHMetrics(info,iVar34,&local_bc,&local_5c);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (info,iVar34,(float)spc->h_oversample * local_a8,
                       (float)spc->v_oversample * local_a8,0.0,0.0,&local_c0,&local_c4,&local_60,
                       &local_64);
            stbtt_MakeGlyphBitmapSubpixel
                      (info,spc->pixels +
                            (ulong)psVar40[3] * (long)spc->stride_in_bytes + (ulong)psVar40[2],
                       ((uint)*psVar40 - spc->h_oversample) + 1,
                       ((uint)psVar40[1] - spc->v_oversample) + 1,spc->stride_in_bytes,
                       (float)spc->h_oversample * local_a8,(float)spc->v_oversample * local_a8,0.0,
                       0.0,iVar34);
            if (1 < spc->h_oversample) {
              stbtt__h_prefilter(spc->pixels +
                                 (ulong)psVar40[3] * (long)spc->stride_in_bytes + (ulong)psVar40[2],
                                 (uint)*psVar40,(uint)psVar40[1],spc->stride_in_bytes,
                                 spc->h_oversample);
            }
            if (1 < spc->v_oversample) {
              stbtt__v_prefilter(spc->pixels +
                                 (ulong)psVar40[3] * (long)spc->stride_in_bytes + (ulong)psVar40[2],
                                 (uint)*psVar40,(uint)psVar40[1],spc->stride_in_bytes,
                                 spc->v_oversample);
            }
            *(float *)((long)&local_70->xadvance + lVar41) = (float)local_bc * local_a8;
            *(ulong *)((long)&local_70->xoff + lVar41) =
                 CONCAT44((float)local_c4 * (float)local_48._4_4_ + (float)local_b8._4_4_,
                          (float)local_c0 * (float)local_48._0_4_ + (float)local_b8._0_4_);
            uVar38 = *(uint *)(psVar40 + 2);
            *(uint *)((long)&local_70->x0 + lVar41) = uVar38;
            uVar39 = *(uint *)psVar40;
            sVar46 = (short)(uVar39 >> 0x10);
            *(uint *)((long)&local_70->x1 + lVar41) =
                 CONCAT22((short)(uVar38 >> 0x10) + sVar46,(short)uVar38 + (short)uVar39);
            auVar45._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
            auVar45._4_2_ = sVar46;
            auVar45._0_4_ = uVar39;
            pfVar3 = (float *)((long)&local_70->xoff2 + lVar41);
            *pfVar3 = (float)(int)((uVar39 & 0xffff) + local_c0) * (float)local_48._0_4_ +
                      (float)local_b8._0_4_;
            pfVar3[1] = (float)(auVar45._4_4_ + local_c4) * (float)local_48._4_4_ +
                        (float)local_b8._4_4_;
            psVar42 = local_78;
            if (iVar34 == 0) {
              uVar43 = uVar37 & 0xffffffff;
            }
          }
          uVar37 = uVar37 + 1;
          psVar40 = psVar40 + 8;
          lVar41 = lVar41 + 0x1c;
        } while ((long)uVar37 < (long)psVar42->num_chars);
        iVar36 = iVar36 + (int)uVar37;
        ranges = local_98;
        psVar40 = local_90;
      }
      local_80 = local_80 + 1;
    } while (local_80 != local_88);
  }
  spc->h_oversample = (undefined4)local_58;
  spc->v_oversample = local_58._4_4_;
  return iVar35;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
int i,j,k, missing_glyph = -1, return_value = 1;

/*  save current values */
int old_h_over = spc->h_oversample;
int old_v_over = spc->v_oversample;

k = 0;
for (i=0; i < num_ranges; ++i) {
float fh = ranges[i].font_size;
float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
float recip_h,recip_v,sub_x,sub_y;
spc->h_oversample = ranges[i].h_oversample;
spc->v_oversample = ranges[i].v_oversample;
recip_h = 1.0f / spc->h_oversample;
recip_v = 1.0f / spc->v_oversample;
sub_x = stbtt__oversample_shift(spc->h_oversample);
sub_y = stbtt__oversample_shift(spc->v_oversample);
for (j=0; j < ranges[i].num_chars; ++j) {
stbrp_rect *r = &rects[k];
if (r->was_packed && r->w != 0 && r->h != 0) {
stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
int advance, lsb, x0,y0,x1,y1;
int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
int glyph = stbtt_FindGlyphIndex(info, codepoint);
stbrp_coord pad = (stbrp_coord) spc->padding;

/*  pad on left and top */
r->x += pad;
r->y += pad;
r->w -= pad;
r->h -= pad;
stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
stbtt_GetGlyphBitmapBox(info, glyph,
scale * spc->h_oversample,
scale * spc->v_oversample,
&x0,&y0,&x1,&y1);
stbtt_MakeGlyphBitmapSubpixel(info,
spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w - spc->h_oversample+1,
r->h - spc->v_oversample+1,
spc->stride_in_bytes,
scale * spc->h_oversample,
scale * spc->v_oversample,
0,0,
glyph);

if (spc->h_oversample > 1)
stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w, r->h, spc->stride_in_bytes,
spc->h_oversample);

if (spc->v_oversample > 1)
stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w, r->h, spc->stride_in_bytes,
spc->v_oversample);

bc->x0       = (stbtt_int16)  r->x;
bc->y0       = (stbtt_int16)  r->y;
bc->x1       = (stbtt_int16) (r->x + r->w);
bc->y1       = (stbtt_int16) (r->y + r->h);
bc->xadvance =                scale * advance;
bc->xoff     =       (float)  x0 * recip_h + sub_x;
bc->yoff     =       (float)  y0 * recip_v + sub_y;
bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;

if (glyph == 0)
missing_glyph = j;
} else if (spc->skip_missing) {
return_value = 0;
} else if (r->was_packed && r->w == 0 && r->h == 0 && missing_glyph >= 0) {
ranges[i].chardata_for_range[j] = ranges[i].chardata_for_range[missing_glyph];
} else {
return_value = 0; /*  if any fail, report failure */
}

++k;
}
}

/*  restore original values */
spc->h_oversample = old_h_over;
spc->v_oversample = old_v_over;

return return_value;
}